

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall
QRenderRule::configurePalette(QRenderRule *this,QPalette *p,ColorGroup cg,QWidget *w,bool embedded)

{
  QSharedDataPointer<QStyleSheetBackgroundData> *this_00;
  QStyleSheetBorderData *pQVar1;
  char cVar2;
  bool bVar3;
  ColorRole CVar4;
  QStyleSheetPaletteData *pQVar5;
  QStyleSheetBackgroundData *pQVar6;
  ColorGroup CVar7;
  QSharedDataPointer<QStyleSheetPaletteData> *this_01;
  long in_FS_OFFSET;
  QBrush placeholder;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->bg;
  pQVar6 = (this->bg).d.ptr;
  CVar7 = (ColorGroup)p;
  if (pQVar6 != (QStyleSheetBackgroundData *)0x0) {
    if ((__int_type)
        (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      pQVar6 = (this_00->d).ptr;
      if (pQVar6 == (QStyleSheetBackgroundData *)0x0) goto LAB_00356467;
    }
    if ((pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      pQVar6 = (this_00->d).ptr;
    }
    if (*(int *)(*(long *)&pQVar6->brush + 4) != 0) {
      if ((pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      QPalette::setBrush(CVar7,cg,(QBrush *)0x9);
      if ((__int_type)
          (((this_00->d).ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      QPalette::setBrush(CVar7,cg,(QBrush *)0x1);
      CVar4 = QWidget::backgroundRole(w);
      if ((__int_type)
          (((this_00->d).ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      QPalette::setBrush(CVar7,cg,(QBrush *)(ulong)CVar4);
      if ((__int_type)
          (((this_00->d).ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      QPalette::setBrush(CVar7,cg,(QBrush *)&DAT_0000000a);
    }
  }
LAB_00356467:
  if (!embedded) goto LAB_003564f2;
  if ((this_00->d).ptr == (QStyleSheetBackgroundData *)0x0) {
LAB_0035649d:
    pQVar1 = (this->bd).d.ptr;
    if ((pQVar1 == (QStyleSheetBorderData *)0x0) ||
       ((pQVar1->bi).d.ptr == (QStyleSheetBorderImageData *)0x0)) goto LAB_003564f2;
    cVar2 = QPixmap::isNull();
    if (cVar2 != '\0') goto LAB_003564f2;
  }
  else {
    cVar2 = QPixmap::isNull();
    pQVar6 = (this_00->d).ptr;
    if ((cVar2 != '\0') && (*(int *)(*(long *)&pQVar6->brush + 4) == 0)) goto LAB_0035649d;
    bVar3 = QStyleSheetBackgroundData::isTransparent(pQVar6);
    if (!bVar3) goto LAB_0035649d;
  }
  CVar4 = QWidget::backgroundRole(w);
  QBrush::QBrush((QBrush *)&local_48,NoBrush);
  QPalette::setBrush(CVar7,cg,(QBrush *)(ulong)CVar4);
  QBrush::~QBrush((QBrush *)&local_48);
LAB_003564f2:
  pQVar5 = (this->pal).d.ptr;
  if (pQVar5 != (QStyleSheetPaletteData *)0x0) {
    this_01 = &this->pal;
    if ((__int_type)
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      pQVar5 = (this_01->d).ptr;
    }
    if (*(int *)(*(long *)&pQVar5->foreground + 4) != 0) {
      if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
        pQVar5 = (this_01->d).ptr;
      }
      setDefault(p,cg,ButtonText,&pQVar5->foreground,w);
      CVar4 = QWidget::foregroundRole(w);
      pQVar5 = (this_01->d).ptr;
      if ((__int_type)
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
        pQVar5 = (this_01->d).ptr;
      }
      setDefault(p,cg,CVar4,&pQVar5->foreground,w);
      pQVar5 = (this_01->d).ptr;
      if ((__int_type)
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
        pQVar5 = (this_01->d).ptr;
      }
      setDefault(p,cg,WindowText,&pQVar5->foreground,w);
      pQVar5 = (this_01->d).ptr;
      if ((__int_type)
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
        pQVar5 = (this_01->d).ptr;
      }
      setDefault(p,cg,Text,&pQVar5->foreground,w);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (this_01->d).ptr;
      if ((__int_type)
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
        pQVar5 = (this_01->d).ptr;
      }
      local_48 = *(undefined1 **)(*(long *)&pQVar5->foreground + 8);
      puStack_40 = *(undefined1 **)(*(long *)&pQVar5->foreground + 0x10);
      QColor::alpha();
      QColor::setAlpha((int)&local_48);
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (this_01->d).ptr;
      if ((__int_type)
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
        pQVar5 = (this_01->d).ptr;
      }
      QBrush::QBrush((QBrush *)&local_50,&pQVar5->foreground);
      QBrush::setColor((QColor *)&local_50);
      setDefault(p,cg,PlaceholderText,(QBrush *)&local_50,w);
      QBrush::~QBrush((QBrush *)&local_50);
      pQVar5 = (this_01->d).ptr;
    }
    if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      pQVar5 = (this_01->d).ptr;
    }
    if (*(int *)(*(long *)&pQVar5->selectionBackground + 4) != 0) {
      if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar7,cg,(QBrush *)0xc);
      pQVar5 = (this_01->d).ptr;
    }
    if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      pQVar5 = (this_01->d).ptr;
    }
    if (*(int *)(*(long *)&pQVar5->selectionForeground + 4) != 0) {
      if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar7,cg,(QBrush *)0xd);
      pQVar5 = (this_01->d).ptr;
    }
    if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      pQVar5 = (this_01->d).ptr;
    }
    if (*(int *)(*(long *)&pQVar5->alternateBackground + 4) != 0) {
      if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar7,cg,(QBrush *)0x10);
      pQVar5 = (this_01->d).ptr;
    }
    if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      pQVar5 = (this_01->d).ptr;
    }
    if (*(int *)(*(long *)&pQVar5->placeholderForeground + 4) != 0) {
      if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar7,cg,(QBrush *)0x14);
      pQVar5 = (this_01->d).ptr;
    }
    if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      pQVar5 = (this_01->d).ptr;
    }
    if (*(int *)(*(long *)&pQVar5->accent + 4) != 0) {
      if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar7,cg,(QBrush *)0x15);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::configurePalette(QPalette *p, QPalette::ColorGroup cg, const QWidget *w, bool embedded)
{
    if (bg && bg->brush.style() != Qt::NoBrush) {
        p->setBrush(cg, QPalette::Base, bg->brush); // for windows, windowxp
        p->setBrush(cg, QPalette::Button, bg->brush); // for plastique
        p->setBrush(cg, w->backgroundRole(), bg->brush);
        p->setBrush(cg, QPalette::Window, bg->brush);
    }

    if (embedded) {
        /* For embedded widgets (ComboBox, SpinBox and ScrollArea) we want the embedded widget
         * to be transparent when we have a transparent background or border image */
        if ((hasBackground() && background()->isTransparent())
            || (hasBorder() && border()->hasBorderImage() && !border()->borderImage()->pixmap.isNull()))
            p->setBrush(cg, w->backgroundRole(), Qt::NoBrush);
    }

    if (!hasPalette())
        return;

    if (pal->foreground.style() != Qt::NoBrush) {
        setDefault(p, cg, QPalette::ButtonText, pal->foreground, w);
        setDefault(p, cg, w->foregroundRole(), pal->foreground, w);
        setDefault(p, cg, QPalette::WindowText, pal->foreground, w);
        setDefault(p, cg, QPalette::Text, pal->foreground, w);
        QColor phColor(pal->foreground.color());
        phColor.setAlpha((phColor.alpha() + 1) / 2);
        QBrush placeholder = pal->foreground;
        placeholder.setColor(phColor);
        setDefault(p, cg, QPalette::PlaceholderText, placeholder, w);
    }
    if (pal->selectionBackground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::Highlight, pal->selectionBackground);
    if (pal->selectionForeground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::HighlightedText, pal->selectionForeground);
    if (pal->alternateBackground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::AlternateBase, pal->alternateBackground);
    if (pal->placeholderForeground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::PlaceholderText, pal->placeholderForeground);
    if (pal->accent.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::Accent, pal->accent);
}